

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.h
# Opt level: O2

void __thiscall
chrono::fea::ChLoadXYZROTnodeBodyBushingMate::~ChLoadXYZROTnodeBodyBushingMate
          (ChLoadXYZROTnodeBodyBushingMate *this)

{
  ChLoadCustomMultiple::~ChLoadCustomMultiple((ChLoadCustomMultiple *)this);
  ::operator_delete(this,0x3f8);
  return;
}

Assistant:

class ChApi ChLoadXYZROTnodeBodyBushingMate : public ChLoadXYZROTnodeBodyBushingSpherical {
  public:
    ChLoadXYZROTnodeBodyBushingMate(
        std::shared_ptr<ChNodeFEAxyzrot> mnodeA,  ///< node A
        std::shared_ptr<ChBody> mbodyB,           ///< body B
        const ChFrame<>& abs_application,         ///< create the bushing here, in abs. coordinates.
        const ChVector<>& mstiffness,             ///< stiffness, along x y z axes of the abs_application
        const ChVector<>& mdamping,               ///< damping, along x y z axes of the abs_application
        const ChVector<>& mrotstiffness,          ///< rotational stiffness, about x y z axes of the abs_application
        const ChVector<>& mrotdamping             ///< rotational damping, about x y z axes of the abs_application
    );

    /// Set radial stiffness, along the x y z axes of loc_application_B, es [N/m]
    void SetRotationalStiffness(const ChVector<> mstiffness) { rot_stiffness = mstiffness; }
    ChVector<> GetRotationalStiffness() const { return rot_stiffness; }

    /// Set radial damping, along the x y z axes of loc_application_B, es [Ns/m]
    void SetRotationalDamping(const ChVector<> mdamping) { rot_damping = mdamping; }
    ChVector<> GetRotationalDamping() const { return rot_damping; }

  protected:
    ChVector<> rot_stiffness;
    ChVector<> rot_damping;

    /// Compute the wrench (force & torque) between the two nodes, expressed in local frame of loc_application_B,
    /// given rel_AB, i.e. the position and speed of loc_application_A respect to loc_application_B, expressed in frame
    /// of loc_application_B. Force is assumed applied to loc_application_B, and its opposite reaction to A.
    virtual void ComputeForceTorque(const ChFrameMoving<>& rel_AB,
                                    ChVector<>& loc_force,
                                    ChVector<>& loc_torque) override;
}